

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O3

void __thiscall
proto2_unittest::AggregateMessageSetElement::~AggregateMessageSetElement
          (AggregateMessageSetElement *this)

{
  ~AggregateMessageSetElement(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

AggregateMessageSetElement::~AggregateMessageSetElement() {
  // @@protoc_insertion_point(destructor:proto2_unittest.AggregateMessageSetElement)
  SharedDtor(*this);
}